

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCuesData.cpp
# Opt level: O3

bool __thiscall libmatroska::KaxCuePoint::IsSmallerThan(KaxCuePoint *this,EbmlElement *EltB)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EbmlElement *pEVar2;
  EbmlElement *pEVar3;
  
  iVar1 = (*(this->super_EbmlMaster).super_EbmlElement._vptr_EbmlElement[3])();
  if ((*(long *)(ClassInfos._8_8_ + 8) != *(long *)((int *)CONCAT44(extraout_var,iVar1) + 2)) ||
     (*(int *)ClassInfos._8_8_ != *(int *)CONCAT44(extraout_var,iVar1))) {
    __assert_fail("EbmlId(*this) == EBML_ID(KaxCuePoint)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxCuesData.cpp"
                  ,0x96,
                  "virtual bool libmatroska::KaxCuePoint::IsSmallerThan(const EbmlElement *) const")
    ;
  }
  iVar1 = (*EltB->_vptr_EbmlElement[3])(EltB);
  if ((*(long *)(ClassInfos._8_8_ + 8) == *(long *)((int *)CONCAT44(extraout_var_00,iVar1) + 2)) &&
     (*(int *)ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var_00,iVar1))) {
    pEVar2 = libebml::EbmlMaster::FindElt
                       (&this->super_EbmlMaster,(EbmlCallbacks *)KaxCueTime::ClassInfos);
    if ((pEVar2 != (EbmlElement *)0x0) &&
       (pEVar3 = libebml::EbmlMaster::FindElt
                           ((EbmlMaster *)EltB,(EbmlCallbacks *)KaxCueTime::ClassInfos),
       pEVar3 != (EbmlElement *)0x0)) {
      iVar1 = (*pEVar2->_vptr_EbmlElement[0xc])(pEVar2,pEVar3);
      if ((char)iVar1 != '\0') {
        return true;
      }
      iVar1 = (*pEVar3->_vptr_EbmlElement[0xc])(pEVar3,pEVar2);
      if ((((char)iVar1 == '\0') &&
          (pEVar2 = libebml::EbmlMaster::FindElt
                              (&this->super_EbmlMaster,(EbmlCallbacks *)KaxCueTrack::ClassInfos),
          pEVar2 != (EbmlElement *)0x0)) &&
         (pEVar3 = libebml::EbmlMaster::FindElt
                             ((EbmlMaster *)EltB,(EbmlCallbacks *)KaxCueTrack::ClassInfos),
         pEVar3 != (EbmlElement *)0x0)) {
        iVar1 = (*pEVar2->_vptr_EbmlElement[0xc])(pEVar2,pEVar3);
        if ((char)iVar1 != '\0') {
          return true;
        }
        (*pEVar3->_vptr_EbmlElement[0xc])(pEVar3,pEVar2);
      }
    }
    return false;
  }
  __assert_fail("EbmlId(*EltB) == EBML_ID(KaxCuePoint)",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxCuesData.cpp"
                ,0x97,
                "virtual bool libmatroska::KaxCuePoint::IsSmallerThan(const EbmlElement *) const");
}

Assistant:

bool KaxCuePoint::IsSmallerThan(const EbmlElement * EltB) const
{
  assert(EbmlId(*this) == EBML_ID(KaxCuePoint));
  assert(EbmlId(*EltB) == EBML_ID(KaxCuePoint));

  const KaxCuePoint & theEltB = *static_cast<const KaxCuePoint *>(EltB);

  // compare timecode
  const KaxCueTime * TimeCodeA = static_cast<const KaxCueTime *>(FindElt(EBML_INFO(KaxCueTime)));
  if (TimeCodeA == NULL)
    return false;

  const KaxCueTime * TimeCodeB = static_cast<const KaxCueTime *>(theEltB.FindElt(EBML_INFO(KaxCueTime)));
  if (TimeCodeB == NULL)
    return false;

  if (TimeCodeA->IsSmallerThan(TimeCodeB))
    return true;

  if (TimeCodeB->IsSmallerThan(TimeCodeA))
    return false;

  // compare tracks (timecodes are equal)
  const KaxCueTrack * TrackA = static_cast<const KaxCueTrack *>(FindElt(EBML_INFO(KaxCueTrack)));
  if (TrackA == NULL)
    return false;

  const KaxCueTrack * TrackB = static_cast<const KaxCueTrack *>(theEltB.FindElt(EBML_INFO(KaxCueTrack)));
  if (TrackB == NULL)
    return false;

  if (TrackA->IsSmallerThan(TrackB))
    return true;

  if (TrackB->IsSmallerThan(TrackA))
    return false;

  return false;
}